

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

shared_ptr<aeron::ExclusivePublication> __thiscall
aeron::archive::AeronArchive::addRecordedExclusivePublication
          (AeronArchive *this,string *channel,int32_t streamId)

{
  undefined8 channel_00;
  bool bVar1;
  int32_t sessionId;
  element_type *peVar2;
  __shared_ptr *this_00;
  element_type *this_01;
  int32_t in_ECX;
  undefined4 in_register_00000014;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<aeron::ExclusivePublication> sVar3;
  string local_78;
  undefined1 local_48 [32];
  int64_t pubId;
  undefined8 uStack_20;
  int32_t streamId_local;
  string *channel_local;
  AeronArchive *this_local;
  shared_ptr<aeron::ExclusivePublication> *publication;
  
  uStack_20 = CONCAT44(in_register_00000014,streamId);
  pubId._4_4_ = in_ECX;
  channel_local = channel;
  this_local = this;
  peVar2 = std::__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )&channel[9]._M_string_length);
  local_48._24_8_ = Aeron::addExclusivePublication(peVar2,(string *)uStack_20,pubId._4_4_);
  local_48[0x17] = 0;
  std::shared_ptr<aeron::ExclusivePublication>::shared_ptr
            ((shared_ptr<aeron::ExclusivePublication> *)this);
  while( true ) {
    peVar2 = std::__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&channel[9]._M_string_length);
    Aeron::findExclusivePublication((Aeron *)local_48,(int64_t)peVar2);
    this_00 = (__shared_ptr *)
              std::shared_ptr<aeron::ExclusivePublication>::operator=
                        ((shared_ptr<aeron::ExclusivePublication> *)this,
                         (shared_ptr<aeron::ExclusivePublication> *)local_48);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
    std::shared_ptr<aeron::ExclusivePublication>::~shared_ptr
              ((shared_ptr<aeron::ExclusivePublication> *)local_48);
    channel_00 = uStack_20;
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::this_thread::yield();
  }
  this_01 = std::
            __shared_ptr_access<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  sessionId = ExclusivePublication::sessionId(this_01);
  ChannelUri::addSessionId(&local_78,(string *)channel_00,sessionId);
  startRecording((AeronArchive *)channel,&local_78,pubId._4_4_,LOCAL);
  std::__cxx11::string::~string((string *)&local_78);
  sVar3.super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<aeron::ExclusivePublication>)
         sVar3.super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<aeron::ExclusivePublication> AeronArchive::addRecordedExclusivePublication(const std::string& channel,
                                                                                           std::int32_t streamId) {
    std::int64_t pubId = aeron_->addExclusivePublication(channel, streamId);
    std::shared_ptr<aeron::ExclusivePublication> publication;
    while (!(publication = aeron_->findExclusivePublication(pubId))) {
        std::this_thread::yield();
    }

    startRecording(ChannelUri::addSessionId(channel, publication->sessionId()), streamId,
                   codecs::SourceLocation::LOCAL);

    return publication;
}